

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigTransform.cpp
# Opt level: O0

void __thiscall
xmrig::ConfigTransform::transform(ConfigTransform *this,Document *doc,int key,char *arg)

{
  char *pcVar1;
  ConfigTransform *this_00;
  size_t sVar2;
  char *in_RCX;
  int in_EDX;
  unsigned_long in_RSI;
  long in_RDI;
  char *p;
  char *in_stack_000000c8;
  int in_stack_000000d4;
  Document *in_stack_000000d8;
  BaseTransform *in_stack_000000e0;
  char *in_stack_ffffffffffffff70;
  Document *in_stack_ffffffffffffff78;
  ConfigTransform *in_stack_ffffffffffffff80;
  uint64_t in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  bool value;
  int key_00;
  Document *in_stack_ffffffffffffff98;
  ConfigTransform *in_stack_ffffffffffffffa0;
  Document *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  BaseTransform::transform(in_stack_000000e0,in_stack_000000d8,in_stack_000000d4,in_stack_000000c8);
  if ((in_EDX == 0x74) || (in_EDX == 0x76)) {
LAB_0022ef51:
    strtol(in_RCX,(char **)0x0,10);
    transformUint64(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                    (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),in_stack_ffffffffffffff88);
  }
  else {
    if (in_EDX != 0x3f1) {
      if (in_EDX == 0x3fc) {
        pcVar1 = strstr(in_RCX,"0x");
        key_00 = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
        if (pcVar1 == (char *)0x0) {
          this_00 = (ConfigTransform *)strtoull(in_RCX,(char **)0x0,10);
        }
        else {
          this_00 = (ConfigTransform *)strtoull(pcVar1,(char **)0x0,0x10);
        }
        transformUint64(this_00,in_stack_ffffffffffffff98,key_00,in_stack_ffffffffffffff88);
        return;
      }
      if (in_EDX == 0x3fd) goto LAB_0022ef51;
      if (in_EDX != 0x400) {
        if (in_EDX == 0x402) {
          pcVar1 = kCpu;
          strtol(in_RCX,(char **)0x0,10);
          BaseTransform::set<unsigned_long>
                    ((BaseTransform *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,pcVar1,in_RSI);
          return;
        }
        if (in_EDX == 0x403) {
          strtol(in_RCX,(char **)0x0,10);
          BaseTransform::set<long>
                    ((BaseTransform *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                     (char *)in_stack_ffffffffffffff98,(long)in_stack_ffffffffffffff90);
          return;
        }
        value = SUB81((ulong)in_stack_ffffffffffffff90 >> 0x38,0);
        if (in_EDX == 0x4b3) {
          BaseTransform::set<bool>
                    ((BaseTransform *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                     (char *)in_stack_ffffffffffffff98,value);
          BaseTransform::set<char_const*>
                    ((BaseTransform *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                     (char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
          return;
        }
        if (in_EDX == 0x4b7) {
          BaseTransform::set<bool>
                    ((BaseTransform *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                     (char *)in_stack_ffffffffffffff98,value);
          return;
        }
        if (in_EDX == 0x4b8) {
          BaseTransform::set<char_const*>
                    ((BaseTransform *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                     (char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
          return;
        }
        if (in_EDX == 0x4b9) {
          BaseTransform::set<bool>
                    ((BaseTransform *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                     (char *)in_stack_ffffffffffffff98,value);
          return;
        }
        if (in_EDX == 0x4ba) {
          strtol(in_RCX,(char **)0x0,10);
          BaseTransform::set<unsigned_long>
                    (&in_stack_ffffffffffffff80->super_BaseTransform,in_stack_ffffffffffffff78,
                     in_stack_ffffffffffffff70,in_RSI);
          return;
        }
        if (in_EDX != 0x578) {
          if (in_EDX == 0x57a) {
            *(undefined1 *)(in_RDI + 0xd) = 1;
            BaseTransform::set<char_const*>
                      ((BaseTransform *)
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                       (char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
            return;
          }
          if (in_EDX == 0x57c) {
            BaseTransform::set<bool>
                      ((BaseTransform *)
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                       (char *)in_stack_ffffffffffffff98,value);
            return;
          }
          if (in_EDX == 0x57e) {
            BaseTransform::set<char_const*>
                      ((BaseTransform *)
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                       (char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
            return;
          }
          if (in_EDX != 0x583) {
            return;
          }
          *(undefined1 *)(in_RDI + 0xd) = 1;
          return;
        }
        sVar2 = strlen(in_RCX);
        if (sVar2 < 3) {
          strtol(in_RCX,(char **)0x0,10);
          BaseTransform::set<unsigned_long>
                    ((BaseTransform *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                     (char *)in_stack_ffffffffffffff98,(unsigned_long)in_stack_ffffffffffffff90);
          return;
        }
        BaseTransform::set<char_const*>
                  ((BaseTransform *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                   (char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        return;
      }
    }
    transformBoolean(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                     (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                     SUB81((ulong)in_stack_ffffffffffffff70 >> 0x18,0));
  }
  return;
}

Assistant:

void xmrig::ConfigTransform::transform(rapidjson::Document &doc, int key, const char *arg)
{
    BaseTransform::transform(doc, key, arg);

    switch (key) {
    case IConfig::AVKey:          /* --av */
    case IConfig::CPUPriorityKey: /* --cpu-priority */
    case IConfig::ThreadsKey:     /* --threads */
        return transformUint64(doc, key, static_cast<uint64_t>(strtol(arg, nullptr, 10)));

    case IConfig::HugePagesKey: /* --no-huge-pages */
    case IConfig::CPUKey:       /* --no-cpu */
        return transformBoolean(doc, key, false);

    case IConfig::CPUAffinityKey: /* --cpu-affinity */
        {
            const char *p  = strstr(arg, "0x");
            return transformUint64(doc, key, p ? strtoull(p, nullptr, 16) : strtoull(arg, nullptr, 10));
        }

    case IConfig::CPUMaxThreadsKey: /* --cpu-max-threads-hint */
        return set(doc, kCpu, "max-threads-hint", static_cast<uint64_t>(strtol(arg, nullptr, 10)));

    case IConfig::MemoryPoolKey: /* --cpu-memory-pool */
        return set(doc, kCpu, "memory-pool", static_cast<int64_t>(strtol(arg, nullptr, 10)));
        break;

#   ifdef XMRIG_FEATURE_OPENCL
    case IConfig::OclKey: /* --opencl */
        m_opencl = true;
        break;

    case IConfig::OclCacheKey: /* --opencl-no-cache */
        return set(doc, kOcl, "cache", false);

    case IConfig::OclLoaderKey: /* --opencl-loader */
        return set(doc, kOcl, "loader", arg);

    case IConfig::OclDevicesKey: /* --opencl-devices */
        m_opencl = true;
        return set(doc, kOcl, "devices-hint", arg);

    case IConfig::OclPlatformKey: /* --opencl-platform */
        if (strlen(arg) < 3) {
            return set(doc, kOcl, "platform", static_cast<uint64_t>(strtol(arg, nullptr, 10)));
        }

        return set(doc, kOcl, "platform", arg);
#   endif

#   ifdef XMRIG_FEATURE_CUDA
    case IConfig::CudaKey: /* --cuda */
        return set(doc, kCuda, kEnabled, true);

    case IConfig::CudaLoaderKey: /* --cuda-loader */
        return set(doc, kCuda, "loader", arg);

    case IConfig::CudaDevicesKey: /* --cuda-devices */
        set(doc, kCuda, kEnabled, true);
        return set(doc, kCuda, "devices-hint", arg);
#   endif

#   ifdef XMRIG_FEATURE_NVML
    case IConfig::NvmlKey: /* --no-nvml */
        return set(doc, kCuda, "nvml", false);

    case IConfig::HealthPrintTimeKey: /* --health-print-time */
        return set(doc, "health-print-time", static_cast<uint64_t>(strtol(arg, nullptr, 10)));
#   endif

    default:
        break;
    }
}